

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

bool __thiscall
absl::flags_internal::anon_unknown_0::SpecifiedFlagsCompare::operator()
          (SpecifiedFlagsCompare *this,CommandLineFlag *a,CommandLineFlag *b)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  char *extraout_RDX;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  __x = (basic_string_view<char,_std::char_traits<char>_>)(*(code *)**(undefined8 **)this)();
  iVar2 = (**a->_vptr_CommandLineFlag)(a);
  __y._M_len._4_4_ = extraout_var;
  __y._M_len._0_4_ = iVar2;
  __y._M_str = extraout_RDX;
  bVar1 = std::operator<(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const CommandLineFlag* a, const CommandLineFlag* b) const {
    return a->Name() < b->Name();
  }